

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::operator=(Matrix *this,Matrix *other)

{
  double *pdVar1;
  int iVar2;
  
  if (this != other) {
    iVar2 = other->cols;
    this->rows = other->rows;
    this->cols = iVar2;
    pdVar1 = this->data;
    this->data = other->data;
    other->data = pdVar1;
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(Matrix&& other) noexcept
{
    if (this == &other)
        return *this;

    rows = other.rows;
    cols = other.cols;
    std::swap(data, other.data);

    return *this;
}